

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticCost.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::QuadraticCost::setStateCost
          (QuadraticCost *this,MatrixDynSize *stateHessian,VectorDynSize *stateGradient)

{
  long lVar1;
  long lVar2;
  TimeInvariantObject<iDynTree::MatrixDynSize> *this_00;
  TimeInvariantObject<iDynTree::VectorDynSize> *this_01;
  char *pcVar3;
  
  lVar1 = iDynTree::MatrixDynSize::rows();
  lVar2 = iDynTree::MatrixDynSize::cols();
  if (lVar1 == lVar2) {
    lVar1 = iDynTree::MatrixDynSize::rows();
    lVar2 = iDynTree::VectorDynSize::size();
    if (lVar1 == lVar2) {
      this_00 = (TimeInvariantObject<iDynTree::MatrixDynSize> *)operator_new(0x30);
      TimeInvariantObject<iDynTree::MatrixDynSize>::TimeInvariantObject(this_00,stateHessian);
      std::
      __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
      ::reset<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>
                ((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
                  *)&(this->super_QuadraticLikeCost).m_timeVaryingStateHessian,this_00);
      this_01 = (TimeInvariantObject<iDynTree::VectorDynSize> *)operator_new(0x28);
      TimeInvariantObject<iDynTree::VectorDynSize>::TimeInvariantObject(this_01,stateGradient);
      std::
      __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,(__gnu_cxx::_Lock_policy)2>
      ::reset<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>>
                ((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,(__gnu_cxx::_Lock_policy)2>
                  *)&(this->super_QuadraticLikeCost).m_timeVaryingStateGradient,this_01);
      return true;
    }
    pcVar3 = "stateHessian and stateGradient have inconsistent dimensions.";
  }
  else {
    pcVar3 = "The stateHessian matrix is supposed to be square.";
  }
  iDynTree::reportError("QuadraticCost","setStateCost",pcVar3);
  return false;
}

Assistant:

bool QuadraticCost::setStateCost(const MatrixDynSize &stateHessian, const VectorDynSize &stateGradient)
        {
            if (stateHessian.rows() != stateHessian.cols()) {
                reportError("QuadraticCost", "setStateCost", "The stateHessian matrix is supposed to be square.");
                return false;
            }

            if (stateHessian.rows() != stateGradient.size()) {
                reportError("QuadraticCost", "setStateCost", "stateHessian and stateGradient have inconsistent dimensions.");
                return false;
            }

            m_timeVaryingStateHessian.reset(new TimeInvariantMatrix(stateHessian));
            m_timeVaryingStateGradient.reset(new TimeInvariantVector(stateGradient));

            return true;
        }